

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

int os_read_dir(osdirhdl_t hdl,char *buf,size_t buflen)

{
  dirent *pdVar1;
  size_t sVar2;
  ulong __n;
  int iVar3;
  char *__s;
  
  pdVar1 = readdir((DIR *)hdl);
  if (pdVar1 == (dirent *)0x0) {
    iVar3 = 0;
  }
  else {
    __s = pdVar1->d_name;
    iVar3 = 1;
    if (__s != buf && (buflen != 0 && buf != (char *)0x0)) {
      sVar2 = strlen(__s);
      __n = buflen - 1;
      if (sVar2 < buflen - 1) {
        __n = sVar2;
      }
      memcpy(buf,__s,__n);
      buf[__n] = '\0';
    }
  }
  return iVar3;
}

Assistant:

int os_read_dir(osdirhdl_t hdl, char *buf, size_t buflen)
{
    // Read the next directory entry - if we've exhausted the search,
    // return failure.
    struct dirent *d = readdir(hdl);
    if (d == 0)
        return false;

    // return this entry
    safe_strcpy(buf, buflen, d->d_name);
    return true;
}